

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_image_tga.cxx
# Opt level: O0

void __thiscall xray_re::xr_image::save_tga(xr_image *this,xr_writer *w)

{
  undefined8 local_38;
  char footer [26];
  xr_writer *w_local;
  xr_image *this_local;
  
  unique0x1000019e = w;
  xr_writer::w_u8(w,'\0');
  xr_writer::w_u8(stack0xffffffffffffffe8,'\0');
  xr_writer::w_u8(stack0xffffffffffffffe8,'\x02');
  xr_writer::w_u16(stack0xffffffffffffffe8,0);
  xr_writer::w_u16(stack0xffffffffffffffe8,0);
  xr_writer::w_u8(stack0xffffffffffffffe8,'\0');
  xr_writer::w_u16(stack0xffffffffffffffe8,0);
  xr_writer::w_u16(stack0xffffffffffffffe8,0);
  xr_writer::w_size_u16(stack0xffffffffffffffe8,(ulong)this->m_width);
  xr_writer::w_size_u16(stack0xffffffffffffffe8,(ulong)this->m_height);
  xr_writer::w_u8(stack0xffffffffffffffe8,' ');
  xr_writer::w_u8(stack0xffffffffffffffe8,'/');
  (*stack0xffffffffffffffe8->_vptr_xr_writer[2])
            (stack0xffffffffffffffe8,this->m_data,(ulong)(this->m_width * this->m_height) << 2);
  local_38 = 0;
  builtin_strncpy(footer,"TRUEVISION-XFILE.",0x12);
  (*stack0xffffffffffffffe8->_vptr_xr_writer[2])(stack0xffffffffffffffe8,&local_38,0x1a);
  return;
}

Assistant:

void xr_image::save_tga(xr_writer& w) const
{
	// tga header
	w.w_u8(0);		// ID Length
	w.w_u8(0);		// Color Map Type (none)
	w.w_u8(2);		// Image Type (RGBA)
	w.w_u16(0);
	w.w_u16(0);
	w.w_u8(0);
	w.w_u16(0);		// x
	w.w_u16(0);		// y
	w.w_size_u16(m_width);
	w.w_size_u16(m_height);
	w.w_u8(32);
	w.w_u8(0x2f);
	
	w.w_raw(m_data, m_width*m_height * sizeof(rgba32));

	char footer[] = "\0\0\0\0\0\0\0\0TRUEVISION-XFILE.";
	w.w_raw(footer, sizeof(footer));
}